

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ushort uVar1;
  AddressMode mode;
  long lVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  CpuRegisters *pCVar12;
  IMos6502 *pIVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint *puVar15;
  IMmu *pIVar16;
  IPpu *pIVar17;
  uint64_t uVar18;
  long lVar19;
  char *pcVar20;
  Family family;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  string_view sVar21;
  string_view format_str;
  string_view format_str_00;
  string memory_string;
  string local_388;
  pointer local_368;
  size_type sStack_360;
  ulong local_358;
  ulong local_348;
  long local_338;
  long local_328;
  ulong local_320;
  string opcode_string;
  CpuState state;
  string execution_string;
  string local_2a8;
  Nes nes;
  ifstream fs;
  undefined8 *puVar14;
  undefined4 extraout_var_01;
  
  if (argc == 2) {
    n_e_s::nes::Nes::Nes(&nes);
    std::ifstream::ifstream(&fs,argv[1],_S_bin);
    n_e_s::nes::Nes::load_rom(&nes,(istream *)&fs);
    pCVar12 = n_e_s::nes::Nes::cpu_registers(&nes);
    pCVar12->pc = 0xc000;
    lVar19 = 0;
    iVar7 = 1000000;
    while (iVar5 = iVar7 + -1, iVar7 != 0) {
      n_e_s::nes::Nes::execute(&nes);
      n_e_s::nes::Nes::execute(&nes);
      n_e_s::nes::Nes::execute(&nes);
      n_e_s::nes::Nes::execute(&nes);
      pIVar13 = n_e_s::nes::Nes::cpu(&nes);
      iVar6 = (*(pIVar13->super_ICpu)._vptr_ICpu[4])(pIVar13);
      lVar2 = *(long *)(CONCAT44(extraout_var,iVar6) + 0x18);
      if ((iVar7 == 1000000) || (iVar7 = iVar5, lVar19 != lVar2)) {
        local_328 = lVar2;
        pIVar13 = n_e_s::nes::Nes::cpu(&nes);
        iVar7 = (*(pIVar13->super_ICpu)._vptr_ICpu[4])(pIVar13);
        puVar14 = (undefined8 *)CONCAT44(extraout_var_00,iVar7);
        state.cycle = puVar14[4];
        state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
        super__Optional_payload_base<n_e_s::core::Opcode>._M_payload._0_8_ = *puVar14;
        state.current_opcode.super__Optional_base<n_e_s::core::Opcode,_true,_true>._M_payload.
        super__Optional_payload_base<n_e_s::core::Opcode>._8_8_ = puVar14[1];
        state._16_8_ = puVar14[2];
        state.start_cycle = puVar14[3];
        pIVar13 = n_e_s::nes::Nes::cpu(&nes);
        iVar7 = (*(pIVar13->super_ICpu)._vptr_ICpu[4])(pIVar13);
        puVar15 = (uint *)CONCAT44(extraout_var_01,iVar7);
        local_320 = (ulong)*puVar15;
        uVar11 = puVar15[1];
        mode = puVar15[2];
        uVar1 = (ushort)puVar15[4];
        pIVar16 = n_e_s::nes::Nes::mmu(&nes);
        uVar8 = (*pIVar16->_vptr_IMmu[3])(pIVar16,(pointer)(ulong)uVar1);
        pIVar16 = n_e_s::nes::Nes::mmu(&nes);
        uVar9 = (*pIVar16->_vptr_IMmu[3])
                          (pIVar16,(ulong)(ushort)(uVar1 + 1),pIVar16->_vptr_IMmu,(ulong)(uVar1 + 1)
                          );
        pIVar16 = n_e_s::nes::Nes::mmu(&nes);
        uVar10 = (*pIVar16->_vptr_IMmu[3])
                           (pIVar16,(ulong)(ushort)(uVar1 + 2),pIVar16->_vptr_IMmu,
                            (ulong)(uVar1 + 2));
        local_388.field_2._M_allocated_capacity = (size_type)(uVar8 & 0xff);
        fmt.size_ = 0x22;
        fmt.data_ = (char *)0xe;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)&local_388;
        local_388._M_dataplus._M_p = (pointer)(ulong)uVar1;
        ::fmt::v8::vformat_abi_cxx11_(&opcode_string,(v8 *)"{:04X}  {:02X}",fmt,args_00);
        iVar7 = n_e_s::dis::get_arg_count(mode);
        if (iVar7 < 1) {
          args_03.field_1.values_ = in_R9.values_;
          args_03.desc_ = (unsigned_long_long)&memory_string;
          ::fmt::v8::vformat_abi_cxx11_(&local_388,(v8 *)"      ",(string_view)ZEXT816(6),args_03);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&opcode_string,&local_388);
        }
        else {
          memory_string._M_dataplus._M_p = (pointer)(ulong)(uVar9 & 0xff);
          fmt_00.size_ = 2;
          fmt_00.data_ = (char *)0x7;
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)&memory_string;
          ::fmt::v8::vformat_abi_cxx11_(&local_388,(v8 *)0x11f05f,fmt_00,args_01);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&opcode_string,&local_388);
          std::__cxx11::string::~string((string *)&local_388);
          if (iVar7 == 1) {
            args_02.field_1.values_ = in_R9.values_;
            args_02.desc_ = (unsigned_long_long)&memory_string;
            ::fmt::v8::vformat_abi_cxx11_(&local_388,(v8 *)0x11f06a,(string_view)ZEXT816(3),args_02)
            ;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&opcode_string,&local_388);
          }
          else {
            memory_string._M_dataplus._M_p = (pointer)(ulong)(uVar10 & 0xff);
            fmt_01.size_ = 2;
            fmt_01.data_ = (char *)0x7;
            args_04.field_1.values_ = in_R9.values_;
            args_04.desc_ = (unsigned_long_long)&memory_string;
            ::fmt::v8::vformat_abi_cxx11_(&local_388,(v8 *)0x11f05f,fmt_01,args_04);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&opcode_string,&local_388);
          }
        }
        std::__cxx11::string::~string((string *)&local_388);
        family = (Family)local_320;
        pcVar20 = "*";
        if (family != NOP || (char)uVar11 == -0x16) {
          pcVar20 = " ";
          if ((char)uVar11 == -0x15) {
            pcVar20 = "*";
          }
          if (family - LAX < 8) {
            pcVar20 = "*";
          }
        }
        sVar21 = n_e_s::core::to_string(family);
        local_388.field_2._M_allocated_capacity = (size_type)sVar21._M_str;
        local_388.field_2._8_8_ = sVar21._M_len;
        fmt_02.size_ = 0xdc;
        fmt_02.data_ = (char *)0x5;
        args_05.field_1.args_ = in_R9.args_;
        args_05.desc_ = (unsigned_long_long)&local_388;
        local_388._M_dataplus._M_p = pcVar20;
        ::fmt::v8::vformat_abi_cxx11_(&memory_string,(v8 *)" {}{}",fmt_02,args_05);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&opcode_string,&memory_string);
        std::__cxx11::string::~string((string *)&memory_string);
        uVar4 = state._16_8_;
        pIVar16 = n_e_s::nes::Nes::mmu(&nes);
        pCVar12 = n_e_s::nes::Nes::cpu_registers(&nes);
        n_e_s::dis::get_memory_string_abi_cxx11_
                  (&memory_string,(dis *)&state,(Opcode *)(uVar4 & 0xffff),(uint16_t)pIVar16,
                   (IMmu *)pCVar12,(CpuRegisters *)in_R9.values_);
        pCVar12 = n_e_s::nes::Nes::cpu_registers(&nes);
        local_388._M_dataplus._M_p = (pointer)(ulong)pCVar12->a;
        local_388.field_2._M_allocated_capacity = (size_type)pCVar12->x;
        local_368 = (pointer)(ulong)pCVar12->y;
        local_358 = (ulong)pCVar12->p;
        local_348 = (ulong)pCVar12->sp;
        fmt_03.size_ = 0x22222;
        fmt_03.data_ = (char *)0x2d;
        args_06.field_1.values_ = in_R9.values_;
        args_06.desc_ = (unsigned_long_long)&local_388;
        ::fmt::v8::vformat_abi_cxx11_
                  (&local_2a8,(v8 *)"A:{:02X} X:{:02X} Y:{:02X} P:{:02X} SP:{:02X}",fmt_03,args_06);
        pIVar17 = n_e_s::nes::Nes::ppu(&nes);
        uVar11 = (*pIVar17->_vptr_IPpu[7])(pIVar17);
        pIVar17 = n_e_s::nes::Nes::ppu(&nes);
        uVar8 = (*pIVar17->_vptr_IPpu[6])(pIVar17);
        uVar18 = n_e_s::nes::Nes::current_cycle(&nes);
        local_338 = uVar18 / 0xc + 7;
        local_358 = (ulong)((uVar11 & 0xffff) - 1);
        local_348 = (ulong)(uVar8 & 0xffff);
        local_388._M_dataplus._M_p = opcode_string._M_dataplus._M_p;
        local_388._M_string_length = opcode_string._M_string_length;
        local_388.field_2._M_allocated_capacity = (size_type)memory_string._M_dataplus._M_p;
        local_388.field_2._8_8_ = memory_string._M_string_length;
        local_368 = local_2a8._M_dataplus._M_p;
        sStack_360 = local_2a8._M_string_length;
        fmt_04.size_ = 0x421ddd;
        fmt_04.data_ = (char *)0x20;
        args_07.field_1.args_ = in_R9.args_;
        args_07.desc_ = (unsigned_long_long)&local_388;
        ::fmt::v8::vformat_abi_cxx11_
                  (&execution_string,(v8 *)"{} {:<28}{} PPU:{:3},{:3} CYC:{}",fmt_04,args_07);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&memory_string);
        std::__cxx11::string::~string((string *)&opcode_string);
        local_388._M_dataplus._M_p = execution_string._M_dataplus._M_p;
        local_388._M_string_length = execution_string._M_string_length;
        args.field_1.values_ =
             (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_388;
        args.desc_ = 0xd;
        format_str.size_ = 3;
        format_str.data_ = "{}\n";
        ::fmt::v8::vprint(format_str,args);
        std::__cxx11::string::~string((string *)&execution_string);
        lVar19 = local_328;
        iVar7 = iVar5;
      }
    }
    std::ifstream::~ifstream(&fs);
    n_e_s::nes::Nes::~Nes(&nes);
    iVar7 = 0;
  }
  else {
    format_str_00.size_ = 0x23;
    format_str_00.data_ = "Expected one argument; nestest.nes\n";
    auVar3._8_8_ = 0;
    auVar3._0_8_ = &fs;
    ::fmt::v8::vprint(_stderr,format_str_00,(format_args)(auVar3 << 0x40));
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int main(int argc, char **argv) {
    if (argc != 2) {
        fmt::print(stderr, "Expected one argument; nestest.nes\n");
        return 1;
    }

    try {
        n_e_s::nes::Nes nes;
        std::ifstream fs(argv[1], std::ios::binary);
        nes.load_rom(fs);
        nes.cpu_registers().pc = 0xC000;

        n_e_s::core::CpuState prev_state{};

        for (int i = 0; i < 1000000; ++i) {
            nes.execute();
            nes.execute();
            nes.execute();
            nes.execute();

            const auto state = nes.cpu().state();

            if (i == 0 || prev_state.start_cycle != state.start_cycle) {
                const std::string execution_string = get_execution_string(nes);
                fmt::print("{}\n", execution_string);

                prev_state = state;
            }
        }
    } catch (const std::exception &e) {
        fmt::print(stderr, "Expcetion: {}\n", e.what());
    }
}